

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

TokenType __thiscall
google::protobuf::io::Tokenizer::ConsumeNumber
          (Tokenizer *this,bool started_with_zero,bool started_with_dot)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  undefined7 in_register_00000031;
  size_type __dnew;
  long *local_50;
  long local_48;
  long local_40 [2];
  long local_30;
  
  if ((int)CONCAT71(in_register_00000031,started_with_zero) == 0) {
LAB_0022874d:
    bVar2 = this->current_char_ - 0x30;
    if (started_with_dot) {
      bVar4 = 1;
      while (bVar2 < 10) {
        NextChar(this);
        bVar2 = this->current_char_ - 0x30;
      }
    }
    else {
      while (bVar2 < 10) {
        NextChar(this);
        bVar2 = this->current_char_ - 0x30;
      }
      if (this->current_char_ == '.') {
        NextChar(this);
        bVar4 = 1;
        cVar1 = this->current_char_;
        while ((byte)(cVar1 - 0x30U) < 10) {
          NextChar(this);
          cVar1 = this->current_char_;
        }
      }
      else {
        bVar4 = 0;
      }
    }
    if ((this->current_char_ & 0xdfU) == 0x45) {
      NextChar(this);
      if ((this->current_char_ == '-') || (this->current_char_ == '+')) {
        NextChar(this);
      }
      if ((byte)(this->current_char_ - 0x30U) < 10) {
        do {
          NextChar(this);
        } while ((byte)(this->current_char_ - 0x30U) < 10);
      }
      else {
        local_30 = 0x21;
        local_50 = local_40;
        local_50 = (long *)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_30);
        local_40[0] = local_30;
        *local_50 = 0x7473756d20226522;
        local_50[1] = 0x6c6c6f6620656220;
        *(undefined4 *)(local_50 + 2) = 0x6465776f;
        builtin_strncpy((char *)((long)local_50 + 0x14)," by ",4);
        *(undefined4 *)(local_50 + 3) = 0x6f707865;
        builtin_strncpy((char *)((long)local_50 + 0x1c),"nent",4);
        *(char *)(local_50 + 4) = '.';
        local_48 = local_30;
        *(char *)((long)local_50 + local_30) = '\0';
        (*this->error_collector_->_vptr_ErrorCollector[2])
                  (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,
                   &local_50);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
      }
      bVar4 = 1;
    }
    if ((this->allow_f_after_float_ == true) &&
       ((this->current_char_ == 'f' || (this->current_char_ == 'F')))) {
      NextChar(this);
      bVar4 = 1;
    }
  }
  else {
    if ((this->current_char_ & 0xdfU) == 0x58) {
      NextChar(this);
      if (((byte)(this->current_char_ - 0x30U) < 10) ||
         ((uVar3 = (byte)this->current_char_ - 0x41, uVar3 < 0x26 &&
          ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))) {
        do {
          do {
            NextChar(this);
          } while ((byte)(this->current_char_ - 0x30U) < 10);
          uVar3 = (byte)this->current_char_ - 0x41;
        } while ((uVar3 < 0x26) && ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0));
      }
      else {
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"\"0x\" must be followed by hex digits.","");
        (*this->error_collector_->_vptr_ErrorCollector[2])
                  (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,
                   (string *)&local_50);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
      }
    }
    else {
      if ((!started_with_zero) || (9 < (byte)(this->current_char_ - 0x30U))) goto LAB_0022874d;
      bVar2 = this->current_char_ & 0x38;
      while (bVar2 == 0x30) {
        NextChar(this);
        bVar2 = this->current_char_ & 0xf8;
      }
      if ((byte)(this->current_char_ - 0x30U) < 10) {
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Numbers starting with leading zero must be in octal.","");
        (*this->error_collector_->_vptr_ErrorCollector[2])
                  (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,
                   &local_50);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if ((byte)(this->current_char_ - 0x30U) < 10) {
          bVar4 = 0;
          do {
            NextChar(this);
          } while ((byte)(this->current_char_ - 0x30U) < 10);
          goto LAB_00228920;
        }
      }
    }
    bVar4 = 0;
  }
LAB_00228920:
  bVar2 = this->current_char_;
  if ((bVar2 == 0x5f) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Need space between number and identifier.","");
    (*this->error_collector_->_vptr_ErrorCollector[2])
              (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,&local_50)
    ;
  }
  else {
    if (bVar2 != 0x2e) goto LAB_002289d9;
    local_50 = local_40;
    if (bVar4 == 0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Hex and octal numbers must be integers.","");
      (*this->error_collector_->_vptr_ErrorCollector[2])
                (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,
                 &local_50);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "Already saw decimal point or exponent; can\'t have another one.","");
      (*this->error_collector_->_vptr_ErrorCollector[2])
                (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,
                 &local_50);
    }
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
LAB_002289d9:
  return bVar4 + TYPE_INTEGER;
}

Assistant:

Tokenizer::TokenType Tokenizer::ConsumeNumber(bool started_with_zero,
                                              bool started_with_dot) {
  bool is_float = false;

  if (started_with_zero && (TryConsume('x') || TryConsume('X'))) {
    // A hex number (started with "0x").
    ConsumeOneOrMore<HexDigit>("\"0x\" must be followed by hex digits.");

  } else if (started_with_zero && LookingAt<Digit>()) {
    // An octal number (had a leading zero).
    ConsumeZeroOrMore<OctalDigit>();
    if (LookingAt<Digit>()) {
      AddError("Numbers starting with leading zero must be in octal.");
      ConsumeZeroOrMore<Digit>();
    }

  } else {
    // A decimal number.
    if (started_with_dot) {
      is_float = true;
      ConsumeZeroOrMore<Digit>();
    } else {
      ConsumeZeroOrMore<Digit>();

      if (TryConsume('.')) {
        is_float = true;
        ConsumeZeroOrMore<Digit>();
      }
    }

    if (TryConsume('e') || TryConsume('E')) {
      is_float = true;
      TryConsume('-') || TryConsume('+');
      ConsumeOneOrMore<Digit>("\"e\" must be followed by exponent.");
    }

    if (allow_f_after_float_ && (TryConsume('f') || TryConsume('F'))) {
      is_float = true;
    }
  }

  if (LookingAt<Letter>()) {
    AddError("Need space between number and identifier.");
  } else if (current_char_ == '.') {
    if (is_float) {
      AddError(
        "Already saw decimal point or exponent; can't have another one.");
    } else {
      AddError("Hex and octal numbers must be integers.");
    }
  }

  return is_float ? TYPE_FLOAT : TYPE_INTEGER;
}